

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O1

shared_ptr<dap::ReaderWriter> __thiscall
dap::ReaderWriter::create(ReaderWriter *this,shared_ptr<dap::Reader> *r,shared_ptr<dap::Writer> *w)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Writer WVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<dap::ReaderWriter> sVar4;
  
  WVar3 = (Writer)operator_new(0x40);
  *(undefined8 *)((long)WVar3 + 8) = 0x100000001;
  *(undefined ***)WVar3 = &PTR___Sp_counted_ptr_inplace_00a63da0;
  *(undefined ***)((long)WVar3 + 0x10) = &PTR__RW_00a63e10;
  *(undefined ***)((long)WVar3 + 0x18) = &PTR__RW_00a63e70;
  *(element_type **)((long)WVar3 + 0x20) =
       (r->super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (r->super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)WVar3 + 0x28) = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  *(element_type **)((long)WVar3 + 0x30) =
       (w->super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  _Var2._M_pi = (w->super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)WVar3 + 0x38) = _Var2._M_pi;
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
    }
  }
  this->super_Reader = (Reader)((long)WVar3 + 0x10);
  this->super_Writer = WVar3;
  sVar4.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar4.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<dap::ReaderWriter>)
         sVar4.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ReaderWriter> ReaderWriter::create(
    const std::shared_ptr<Reader>& r,
    const std::shared_ptr<Writer>& w) {
  return std::make_shared<RW>(r, w);
}